

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IR.cpp
# Opt level: O1

bool IR::Instr::HasSymUseSrc(StackSym *sym,Opnd *src)

{
  code *pcVar1;
  OpndKind OVar2;
  OpndKind OVar3;
  bool bVar4;
  bool bVar5;
  undefined4 *puVar6;
  ListOpndType *pLVar7;
  StackSym *pSVar8;
  PropertySymOpnd *this;
  int i;
  
  if (src != (Opnd *)0x0) {
    OVar2 = Opnd::GetKind(src);
    OVar3 = Opnd::GetKind(src);
    if (OVar2 == OpndKindReg) {
      if (OVar3 != OpndKindReg) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar6 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
        if (!bVar4) goto LAB_004c0422;
        *puVar6 = 0;
      }
      pSVar8 = (StackSym *)src[1]._vptr_Opnd;
    }
    else {
      OVar2 = Opnd::GetKind(src);
      if (OVar3 != OpndKindIndir) {
        OVar3 = Opnd::GetKind(src);
        if (OVar2 != OpndKindList) {
          if (OVar3 != OpndKindSym) {
            return false;
          }
          OVar2 = Opnd::GetKind(src);
          if (OVar2 != OpndKindSym) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
            *puVar6 = 1;
            bVar4 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                               ,0x45,"(this->IsSymOpnd())","Bad call to AsSymOpnd()");
            if (!bVar4) goto LAB_004c0422;
            *puVar6 = 0;
          }
          pSVar8 = (StackSym *)Opnd::GetSym(src);
          if (pSVar8 == sym) {
            return true;
          }
          bVar4 = SymOpnd::IsPropertySymOpnd((SymOpnd *)src);
          if (!bVar4) {
            return false;
          }
          this = Opnd::AsPropertySymOpnd(src);
          pSVar8 = PropertySymOpnd::GetObjectSym(this);
          if (pSVar8 != sym) {
            return false;
          }
          return true;
        }
        if (OVar3 != OpndKindList) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar6 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                             ,0x1a4,"(this->IsListOpnd())","Bad call to AsListOpnd()");
          if (!bVar4) {
LAB_004c0422:
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          *puVar6 = 0;
        }
        bVar4 = 0 < *(int *)&src[1]._vptr_Opnd;
        if (*(int *)&src[1]._vptr_Opnd < 1) {
          return false;
        }
        pLVar7 = ListOpnd::Item((ListOpnd *)src,0);
        bVar5 = HasSymUseSrc(sym,&pLVar7->super_Opnd);
        if (!bVar5) {
          i = 1;
          do {
            bVar4 = i < *(int *)&src[1]._vptr_Opnd;
            if (*(int *)&src[1]._vptr_Opnd <= i) {
              return false;
            }
            pLVar7 = ListOpnd::Item((ListOpnd *)src,i);
            bVar5 = HasSymUseSrc(sym,&pLVar7->super_Opnd);
            i = i + 1;
          } while (!bVar5);
        }
        if (!bVar4) {
          return false;
        }
        return true;
      }
      if (OVar2 != OpndKindIndir) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar6 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0x1c8,"(this->IsIndirOpnd())","Bad call to AsIndirOpnd()");
        if (!bVar4) goto LAB_004c0422;
        *puVar6 = 0;
      }
      if ((src[1]._vptr_Opnd != (_func_int **)0x0) && ((StackSym *)src[1]._vptr_Opnd[2] == sym)) {
        return true;
      }
      if (*(long *)&src[1].m_valueType == 0) {
        return false;
      }
      pSVar8 = *(StackSym **)(*(long *)&src[1].m_valueType + 0x10);
    }
    if (pSVar8 == sym) {
      return true;
    }
  }
  return false;
}

Assistant:

bool
Instr::HasSymUseSrc(StackSym *sym, IR::Opnd* src)
{
    if (!src)
    {
        return false;
    }
    if (src->IsRegOpnd())
    {
        RegOpnd *regOpnd = src->AsRegOpnd();

        if (regOpnd->m_sym == sym)
        {
            return true;
        }
    }
    else if (src->IsIndirOpnd())
    {
        IR::IndirOpnd *indirOpnd = src->AsIndirOpnd();
        RegOpnd * baseOpnd = indirOpnd->GetBaseOpnd();
        if (baseOpnd != nullptr && baseOpnd->m_sym == sym)
        {
            return true;
        }
        else if (indirOpnd->GetIndexOpnd() && indirOpnd->GetIndexOpnd()->m_sym == sym)
        {
            return true;
        }
    }
    else if (src->IsListOpnd())
    {
        IR::ListOpnd* list = src->AsListOpnd();
        for (int i = 0; i < list->Count(); ++i)
        {
            if (HasSymUseSrc(sym, list->Item(i)))
            {
                return true;
            }
        }
    }
    else if (src->IsSymOpnd())
    {
        SymOpnd* symOpnd = src->AsSymOpnd();
        if (symOpnd->GetSym() == sym)
        {
            return true;
        }
        if (symOpnd->IsPropertySymOpnd())
        {
            PropertySymOpnd* propertySymOpnd = symOpnd->AsPropertySymOpnd();
            if (propertySymOpnd->GetObjectSym() == sym)
            {
                return true;
            }
        }
    }
    return false;
}